

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytecodeTranslatorMain.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  exception e;
  BytecodeTranslator local_4c1;
  ofstream local_4c0 [7];
  BytecodeTranslator translator;
  ofstream ofs;
  ifstream local_2c0 [8];
  ifstream ifs;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  string local_68 [8];
  string out;
  string local_48 [8];
  string in;
  char **argv_local;
  int argc_local;
  
  op::initMap();
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  if (argc == 3) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,pcVar1,&local_89);
    std::__cxx11::string::operator=(local_48,local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
    std::__cxx11::string::operator=(local_68,local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  else {
    printf("Type input filename:\n");
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_48);
    printf("Type output filename:\n");
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_68);
  }
  std::ifstream::ifstream(local_2c0,local_48,8);
  std::ofstream::ofstream(local_4c0,local_68,0x10);
  BytecodeTranslator::translate(&local_4c1,local_2c0,local_4c0);
  std::ifstream::close();
  std::ofstream::close();
  std::ofstream::~ofstream(local_4c0);
  std::ifstream::~ifstream(local_2c0);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    try {
        op::initMap();
        std::string in, out;

        if (argc == 3) {
            in = std::string(argv[1]);
            out = std::string(argv[2]);
        } else {
            printf("Type input filename:\n");
            getline(std::cin, in);
            printf("Type output filename:\n");
            getline(std::cin, out);
        }
        std::ifstream ifs(in);
        std::ofstream ofs(out);
        BytecodeTranslator translator;
        translator.translate(ifs, ofs);
        ifs.close();
        ofs.close();
    } catch (std::exception e) {
        std::cout << e.what() << '\n';
    }
    return 0;
}